

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::checkSolution(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,
               VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *sol)

{
  Item *pIVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  pointer pnVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  cpp_dec_float<200U,_int,_void> *v;
  long lVar9;
  long lVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  pointer pnVar12;
  uint *puVar13;
  cpp_dec_float<200U,_int,_void> *pcVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  long lVar16;
  long lVar17;
  byte bVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  activity;
  cpp_dec_float<200U,_int,_void> local_428;
  cpp_dec_float<200U,_int,_void> local_3a0;
  cpp_dec_float<200U,_int,_void> local_320;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_220;
  cpp_dec_float<200U,_int,_void> local_1a0;
  uint local_120 [28];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar18 = 0;
  lVar9 = (long)(lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum;
  if (0 < lVar9) {
    do {
      pIVar1 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem;
      iVar8 = (lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[lVar9 + -1].idx;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&local_3a0,0,(type *)0x0);
      if (0 < pIVar1[iVar8].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        pIVar1 = pIVar1 + iVar8;
        lVar17 = 0;
        lVar16 = 0;
        do {
          pNVar2 = (pIVar1->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)&(pNVar2->val).m_backend.data + lVar17)
          ;
          pcVar14 = &(sol->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [*(int *)((long)(&pNVar2->val + 1) + lVar17)].m_backend;
          local_428.fpclass = cpp_dec_float_finite;
          local_428.prec_elem = 0x1c;
          local_428.data._M_elems[0] = 0;
          local_428.data._M_elems[1] = 0;
          local_428.data._M_elems[2] = 0;
          local_428.data._M_elems[3] = 0;
          local_428.data._M_elems[4] = 0;
          local_428.data._M_elems[5] = 0;
          local_428.data._M_elems[6] = 0;
          local_428.data._M_elems[7] = 0;
          local_428.data._M_elems[8] = 0;
          local_428.data._M_elems[9] = 0;
          local_428.data._M_elems[10] = 0;
          local_428.data._M_elems[0xb] = 0;
          local_428.data._M_elems[0xc] = 0;
          local_428.data._M_elems[0xd] = 0;
          local_428.data._M_elems[0xe] = 0;
          local_428.data._M_elems[0xf] = 0;
          local_428.data._M_elems[0x10] = 0;
          local_428.data._M_elems[0x11] = 0;
          local_428.data._M_elems[0x12] = 0;
          local_428.data._M_elems[0x13] = 0;
          local_428.data._M_elems[0x14] = 0;
          local_428.data._M_elems[0x15] = 0;
          local_428.data._M_elems[0x16] = 0;
          local_428.data._M_elems[0x17] = 0;
          local_428.data._M_elems[0x18] = 0;
          local_428.data._M_elems[0x19] = 0;
          local_428.data._M_elems._104_5_ = 0;
          local_428.data._M_elems[0x1b]._1_3_ = 0;
          local_428.exp = 0;
          local_428.neg = false;
          v = pcVar11;
          if ((&local_428 != pcVar14) && (v = pcVar14, pcVar11 != &local_428)) {
            pcVar14 = &local_428;
            for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pcVar14->data)._M_elems[0] = (pcVar11->data)._M_elems[0];
              pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
              pcVar14 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar14 + (ulong)bVar18 * -8 + 4);
            }
            local_428.exp = *(int *)((long)&(pNVar2->val).m_backend.data + lVar17 + 0x70);
            local_428.neg = *(bool *)((long)&(pNVar2->val).m_backend.data + lVar17 + 0x74);
            local_428._120_8_ = *(undefined8 *)((long)&(pNVar2->val).m_backend.data + lVar17 + 0x78)
            ;
          }
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=(&local_428,v);
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&local_3a0,&local_428);
          lVar16 = lVar16 + 1;
          lVar17 = lVar17 + 0x84;
        } while (lVar16 < (pIVar1->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
      }
      lVar16 = lVar9 + -1;
      pcVar11 = &local_3a0;
      pnVar15 = &local_220;
      for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
        (pnVar15->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
        pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      local_220.m_backend.exp = local_3a0.exp;
      local_220.m_backend.neg = local_3a0.neg;
      local_220.m_backend.fpclass = local_3a0.fpclass;
      local_220.m_backend.prec_elem = local_3a0.prec_elem;
      pnVar3 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar12 = pnVar3 + lVar16;
      pnVar15 = &local_2a0;
      for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
        (pnVar15->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
        pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar15 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      local_2a0.m_backend.exp = pnVar3[lVar16].m_backend.exp;
      local_2a0.m_backend.neg = pnVar3[lVar16].m_backend.neg;
      local_2a0.m_backend.fpclass = pnVar3[lVar16].m_backend.fpclass;
      local_2a0.m_backend.prec_elem = pnVar3[lVar16].m_backend.prec_elem;
      feastol(&local_b0,this);
      bVar7 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_220,&local_2a0,&local_b0);
      uVar5 = local_3a0._120_8_;
      bVar4 = local_3a0.neg;
      iVar8 = local_3a0.exp;
      if (!bVar7) {
        return false;
      }
      pcVar11 = &local_3a0;
      puVar13 = local_120;
      for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
        *puVar13 = (pcVar11->data)._M_elems[0];
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
        puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
      }
      pnVar3 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar12 = pnVar3 + lVar16;
      pcVar11 = &local_320;
      for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
        (pcVar11->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar18 * -2 + 1) * 4);
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar18 * -2 + 1) * 4);
      }
      local_320.exp = pnVar3[lVar16].m_backend.exp;
      local_320.neg = pnVar3[lVar16].m_backend.neg;
      local_320.fpclass = pnVar3[lVar16].m_backend.fpclass;
      local_320.prec_elem = pnVar3[lVar16].m_backend.prec_elem;
      feastol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_1a0,this);
      puVar13 = local_120;
      pcVar11 = &local_428;
      for (lVar17 = 0x1c; uVar6 = local_3a0._120_8_, lVar17 != 0; lVar17 = lVar17 + -1) {
        (pcVar11->data)._M_elems[0] = *puVar13;
        puVar13 = puVar13 + (ulong)bVar18 * -2 + 1;
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar18 * -8 + 4);
      }
      local_428.exp = iVar8;
      local_428.neg = bVar4;
      local_3a0.fpclass = (fpclass_type)uVar5;
      local_3a0.prec_elem = SUB84(uVar5,4);
      local_428.fpclass = local_3a0.fpclass;
      local_428.prec_elem = local_3a0.prec_elem;
      local_3a0._120_8_ = uVar6;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                (&local_428,&local_320);
      if (local_428.fpclass == cpp_dec_float_NaN) {
        return false;
      }
      if (local_1a0.fpclass == cpp_dec_float_NaN) {
        return false;
      }
      iVar8 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        (&local_428,&local_1a0);
      if (-1 < iVar8) {
        return false;
      }
      bVar4 = 1 < lVar9;
      lVar9 = lVar16;
    } while (bVar4);
  }
  return true;
}

Assistant:

bool SPxMainSM<R>::checkSolution(SPxLPBase<R>& lp, VectorBase<R> sol)
{
   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      const SVectorBase<R>& row = lp.rowVector(i);
      R activity = 0;

      for(int k = 0; k < row.size(); k++)
         activity += row.value(k) * sol[row.index(k)];

      if(!GE(activity, lp.lhs(i), feastol()) || !LE(activity, lp.rhs(i), feastol()))
         return false;
   }

   return true;
}